

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O1

int argon2_thread_create(argon2_thread_handle_t *handle,argon2_thread_func_t func,void *args)

{
  int iVar1;
  
  if (func == (argon2_thread_func_t)0x0 || handle == (argon2_thread_handle_t *)0x0) {
    return -1;
  }
  iVar1 = pthread_create(handle,(pthread_attr_t *)0x0,(__start_routine *)func,args);
  return iVar1;
}

Assistant:

int argon2_thread_create(argon2_thread_handle_t *handle,
                         argon2_thread_func_t func, void *args) {
    if (NULL == handle || func == NULL) {
        return -1;
    }
#if defined(_WIN32)
    *handle = _beginthreadex(NULL, 0, func, args, 0, NULL);
    return *handle != 0 ? 0 : -1;
#else
    return pthread_create(handle, NULL, func, args);
#endif
}